

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

void * __thiscall ON_XMLVariant::AsBuffer(ON_XMLVariant *this,size_t *size_out)

{
  size_t size;
  ON__UINT8 *pOVar1;
  ON_Buffer buf;
  ON_Buffer OStack_58;
  
  (*this->_vptr_ON_XMLVariant[0x2b])(&OStack_58,this);
  size = ON_Buffer::Size(&OStack_58);
  *size_out = size;
  pOVar1 = this->_private->_raw_buffer;
  if (pOVar1 != (ON__UINT8 *)0x0) {
    operator_delete__(pOVar1);
    size = *size_out;
  }
  pOVar1 = (ON__UINT8 *)operator_new__(size);
  this->_private->_raw_buffer = pOVar1;
  ON_Buffer::Read(&OStack_58,size,pOVar1);
  pOVar1 = this->_private->_raw_buffer;
  ON_Buffer::~ON_Buffer(&OStack_58);
  return pOVar1;
}

Assistant:

void* ON_XMLVariant::AsBuffer(size_t& size_out) const
{
  auto buf = AsBuffer();
  size_out = size_t(buf.Size());

  if (nullptr != _private->_raw_buffer)
    delete[] _private->_raw_buffer;

  _private->_raw_buffer = new ON__UINT8[size_out];
  buf.Read(size_out, _private->_raw_buffer);

  return _private->_raw_buffer;
}